

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

size_t Curl_FormReader(char *buffer,size_t size,size_t nitems,FILE *mydata)

{
  size_t size_00;
  bool bVar1;
  char *local_48;
  size_t gotsize;
  size_t wantedsize;
  Form *form;
  FILE *mydata_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  size_00 = size * nitems;
  if (*(long *)mydata == 0) {
    buffer_local = (char *)0x0;
  }
  else if (((*(int *)(*(long *)mydata + 8) != 3) && (*(int *)(*(long *)mydata + 8) != 2)) ||
          (buffer_local = (char *)readfromfile((Form *)mydata,buffer,size_00),
          buffer_local == (char *)0x0)) {
    local_48 = (char *)0x0;
    do {
      if (size_00 - (long)local_48 <
          (ulong)(*(long *)(*(long *)mydata + 0x18) - (long)mydata->_IO_read_ptr)) {
        memcpy(buffer + (long)local_48,mydata->_IO_read_ptr + *(long *)(*(long *)mydata + 0x10),
               size_00 - (long)local_48);
        mydata->_IO_read_ptr = mydata->_IO_read_ptr + (size_00 - (long)local_48);
        return size_00;
      }
      memcpy(buffer + (long)local_48,mydata->_IO_read_ptr + *(long *)(*(long *)mydata + 0x10),
             *(long *)(*(long *)mydata + 0x18) - (long)mydata->_IO_read_ptr);
      local_48 = local_48 + (*(long *)(*(long *)mydata + 0x18) - (long)mydata->_IO_read_ptr);
      mydata->_IO_read_ptr = (char *)0x0;
      *(undefined8 *)mydata = **(undefined8 **)mydata;
      bVar1 = false;
      if (*(long *)mydata != 0) {
        bVar1 = *(uint *)(*(long *)mydata + 8) < 2;
      }
      buffer_local = local_48;
    } while (bVar1);
  }
  return (size_t)buffer_local;
}

Assistant:

size_t Curl_FormReader(char *buffer,
                       size_t size,
                       size_t nitems,
                       FILE *mydata)
{
  struct Form *form;
  size_t wantedsize;
  size_t gotsize = 0;

  form=(struct Form *)mydata;

  wantedsize = size * nitems;

  if(!form->data)
    return 0; /* nothing, error, empty */

  if((form->data->type == FORM_FILE) ||
     (form->data->type == FORM_CALLBACK)) {
    gotsize = readfromfile(form, buffer, wantedsize);

    if(gotsize)
      /* If positive or -1, return. If zero, continue! */
      return gotsize;
  }
  do {

    if((form->data->length - form->sent ) > wantedsize - gotsize) {

      memcpy(buffer + gotsize , form->data->line + form->sent,
             wantedsize - gotsize);

      form->sent += wantedsize-gotsize;

      return wantedsize;
    }

    memcpy(buffer+gotsize,
           form->data->line + form->sent,
           (form->data->length - form->sent) );
    gotsize += form->data->length - form->sent;

    form->sent = 0;

    form->data = form->data->next; /* advance */

  } while(form->data && (form->data->type < FORM_CALLBACK));
  /* If we got an empty line and we have more data, we proceed to the next
     line immediately to avoid returning zero before we've reached the end. */

  return gotsize;
}